

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::AssociativeArrayType::getDefaultValueImpl(AssociativeArrayType *this)

{
  AssociativeArray *in_RDI;
  AssociativeArray *aa;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *this_00;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_68._16_8_ = 0;
  local_68._24_8_ = 0;
  local_68._0_8_ = 0;
  local_68._8_8_ = 0;
  local_18 = 0;
  this_00 = &local_68;
  aa = in_RDI;
  AssociativeArray::AssociativeArray(in_RDI);
  slang::ConstantValue::ConstantValue((ConstantValue *)this_00,aa);
  AssociativeArray::~AssociativeArray(in_RDI);
  return (ConstantValue *)in_RDI;
}

Assistant:

ConstantValue AssociativeArrayType::getDefaultValueImpl() const {
    return AssociativeArray();
}